

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStoragePython.cpp
# Opt level: O1

PyObject * PyInit_libmilstoragepython(void)

{
  int iVar1;
  undefined8 uVar2;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> *pcVar3;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> *pcVar4;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> blobStorageWriter;
  module m;
  int minor;
  int major;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> blobStorageReader;
  bool local_b9;
  class_<CoreML::MilStoragePython::MilStoragePythonWriter> local_b8;
  handle local_b0;
  int local_a8;
  int local_a4;
  class_<CoreML::MilStoragePython::MilStoragePythonReader> local_a0;
  undefined8 local_98;
  arg local_90;
  arg local_80;
  code *local_70;
  undefined8 local_68;
  arg_v local_60;
  code *local_20;
  undefined8 local_18;
  
  uVar2 = Py_GetVersion();
  iVar1 = __isoc99_sscanf(uVar2,"%i.%i",&local_a4,&local_a8);
  if (iVar1 == 2) {
    if (local_a8 == 10 && local_a4 == 3) {
      pybind11::module::module
                ((module *)&local_b0,"libmilstoragepython",
                 "Library to create, access and edit CoreML blob files.");
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::class_<>
                (&local_b8,local_b0,"_BlobStorageWriter");
      local_90.name = "file_name";
      local_90._8_8_ = local_90._8_8_ & 0xfffffffffffffffe;
      local_b9 = true;
      local_80.name = "truncate_file";
      local_80._8_8_ = local_80._8_8_ & 0xffffffffffffff00;
      pybind11::arg_v::arg_v<bool>(&local_60,&local_80,&local_b9,(char *)0x0);
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
      def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_hollance[P]coremltools_deps_pybind11_include_pybind11_pybind11_h:1504:28),_pybind11::arg,_pybind11::arg_v>
                (&local_b8,"__init__",(type *)&local_80,&local_90,&local_60);
      local_80.name = (char *)CoreML::MilStoragePython::MilStoragePythonWriter::write_int8_data;
      local_80._8_8_ = 0;
      pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
               def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<signed_char,std::allocator<signed_char>>const&)>
                         (&local_b8,"write_int8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_80);
      local_70 = CoreML::MilStoragePython::MilStoragePythonWriter::write_uint8_data;
      local_68 = 0;
      pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
               def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                         (pcVar3,"write_uint8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_70);
      local_a0.super_generic_type.super_object.super_handle.m_ptr =
           (generic_type)CoreML::MilStoragePython::MilStoragePythonWriter::write_fp16_data;
      local_98 = 0;
      pcVar3 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
               def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<unsigned_short,std::allocator<unsigned_short>>const&)>
                         (pcVar3,"write_fp16_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_a0);
      local_20 = CoreML::MilStoragePython::MilStoragePythonWriter::write_float_data;
      local_18 = 0;
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonWriter>::
      def<unsigned_long(CoreML::MilStoragePython::MilStoragePythonWriter::*)(std::vector<float,std::allocator<float>>const&)>
                (pcVar3,"write_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.type._M_dataplus._M_p != &local_60.type.field_2) {
        operator_delete(local_60.type._M_dataplus._M_p,
                        local_60.type.field_2._M_allocated_capacity + 1);
      }
      pybind11::object::~object(&local_60.value);
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::class_<>
                (&local_a0,local_b0,"_BlobStorageReader");
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
      def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_hollance[P]coremltools_deps_pybind11_include_pybind11_pybind11_h:1504:28)>
                (&local_a0,"__init__",(type *)&local_60);
      local_60.super_arg.name =
           (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_int8_data;
      local_60.super_arg._8_8_ = 0;
      pcVar4 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
               def<std::vector<signed_char,std::allocator<signed_char>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                         (&local_a0,"read_int8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_60);
      local_80.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_uint8_data;
      local_80._8_8_ = 0;
      pcVar4 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
               def<std::vector<unsigned_char,std::allocator<unsigned_char>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                         (pcVar4,"read_uint8_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_80);
      local_90.name = (char *)CoreML::MilStoragePython::MilStoragePythonReader::read_fp16_data;
      local_90._8_8_ = 0;
      pcVar4 = pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
               def<std::vector<unsigned_short,std::allocator<unsigned_short>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                         (pcVar4,"read_fp16_data",
                          (offset_in_MilStoragePythonWriter_to_subr *)&local_90);
      local_70 = CoreML::MilStoragePython::MilStoragePythonReader::read_float_data;
      local_68 = 0;
      pybind11::class_<CoreML::MilStoragePython::MilStoragePythonReader>::
      def<std::vector<float,std::allocator<float>>const(CoreML::MilStoragePython::MilStoragePythonReader::*)(unsigned_long)>
                (pcVar4,"read_float_data",(offset_in_MilStoragePythonWriter_to_subr *)&local_70);
      pybind11::object::~object((object *)&local_a0);
      pybind11::object::~object((object *)&local_b8);
      pybind11::object::~object((object *)&local_b0);
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10);
      local_b0.m_ptr = (PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    local_b0.m_ptr = (PyObject *)0x0;
  }
  return local_b0.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(libmilstoragepython) {
    py::module m("libmilstoragepython", "Library to create, access and edit CoreML blob files.");

    py::class_<MilStoragePythonWriter> blobStorageWriter(m, "_BlobStorageWriter");
    blobStorageWriter.def(py::init<const std::string&, bool>(), py::arg("file_name"), py::arg("truncate_file") = true)
      .def("write_int8_data", &MilStoragePythonWriter::write_int8_data)
      .def("write_uint8_data", &MilStoragePythonWriter::write_uint8_data)
      .def("write_fp16_data", &MilStoragePythonWriter::write_fp16_data)
      .def("write_float_data", &MilStoragePythonWriter::write_float_data);

    py::class_<MilStoragePythonReader> blobStorageReader(m, "_BlobStorageReader");
    blobStorageReader.def(py::init<std::string>())
      .def("read_int8_data", &MilStoragePythonReader::read_int8_data)
      .def("read_uint8_data", &MilStoragePythonReader::read_uint8_data)
      .def("read_fp16_data", &MilStoragePythonReader::read_fp16_data)
      .def("read_float_data", &MilStoragePythonReader::read_float_data);

    return m.ptr();
}